

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchMark.cpp
# Opt level: O2

void runBenchMarkWrapper(int howmany,int thread_count)

{
  pointer ptVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  thread *t;
  pointer ptVar5;
  bool bVar6;
  int howmany_local;
  thread local_80;
  string local_78;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<int> msg_counter;
  
  howmany_local = howmany;
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::operator<<((ostream *)&std::cout,
                  "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n"
                 );
  poVar2 = std::operator<<((ostream *)&std::cout,"Wrapper Mode (Rotating mode MT). queue_size = ");
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4130000000000000;
  utils::format<double>(&local_78,(double *)&threads);
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<((ostream *)&std::cout,
                  "*******************************************************************************\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "\n*******************************************************************************\n"
                 );
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,thread_count);
  poVar2 = std::operator<<(poVar2," threads sharing same logger, ");
  utils::format<int>(&local_78,&howmany_local);
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::operator<<(poVar2," iterations");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<((ostream *)&std::cout,
                  "*******************************************************************************\n"
                 );
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)(logLevel._M_node + 1));
  std::operator<<(poVar2,"...\t\t");
  std::ostream::flush();
  msg_counter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = std::chrono::_V2::system_clock::now();
  if (thread_count < 1) {
    thread_count = 0;
  }
  while (ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar6 = thread_count != 0,
        thread_count = thread_count + -1,
        ptVar5 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start, bVar6) {
    local_80._M_id._M_thread = (id)0;
    local_78._M_dataplus._M_p = (pointer)operator_new(0x18);
    *(undefined ***)local_78._M_dataplus._M_p = &PTR___State_00125b28;
    *(atomic<int> **)((long)local_78._M_dataplus._M_p + 8) = &msg_counter;
    *(int **)((long)local_78._M_dataplus._M_p + 0x10) = &howmany_local;
    std::thread::_M_start_thread(&local_80,&local_78,0);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&threads,&local_80);
    std::thread::~thread(&local_80);
  }
  for (; ptVar5 != ptVar1; ptVar5 = ptVar5 + 1) {
    std::thread::join();
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  local_80._M_id._M_thread._0_4_ =
       (int)((double)howmany_local / ((double)(lVar4 - lVar3) / 1000000000.0));
  utils::format<int>(&local_78,(int *)&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_78);
  poVar2 = std::operator<<(poVar2,"/sec");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator<<((ostream *)&std::cout,
                  "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n"
                 );
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return;
}

Assistant:

void runBenchMarkWrapper(int howmany, int thread_count) {
    cout << "\n\n";
    cout << "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
    cout << "Wrapper Mode (Rotating mode MT). queue_size = " << format(std::pow(2, 20)) << "\n";
    cout << "*******************************************************************************\n";
    cout << "\n*******************************************************************************\n";
    cout << thread_count << " threads sharing same logger, " << format(howmany) << " iterations" << endl;
    cout << "*******************************************************************************\n";
    cout << logLevel->first << "...\t\t" << flush;
    std::atomic<int> msg_counter{0};
    vector<thread> threads;
    auto start = system_clock::now();
    for (int t = 0; t < thread_count; ++t)
    {
        threads.push_back(std::thread([&]() {
            for (;;)
            {
                int counter = ++msg_counter;
                if (counter > howmany)
                    break;
                BENChMARK_LOG("Hello logger: msg number {}", counter);
            }
        }));
    }

    for (auto &t : threads)
    {
        t.join();
    };

    auto delta = system_clock::now() - start;
    auto delta_d = duration_cast<duration<double>>(delta).count();
    cout << format(int(howmany / delta_d)) << "/sec" << endl;
    cout << "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
}